

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::Encode(idx2_file *Idx2,params *P,brick_copier *Copier)

{
  metadata *pmVar1;
  cstr __s;
  v3<int> *pvVar2;
  anon_struct_16_2_94731cea_for_anon_union_16_4_6ba14846_for_v2<double>_1_0 aVar3;
  unsigned_long *puVar4;
  anon_union_16_4_6ba14846_for_v2<double>_1 aVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  params *P_00;
  uint uVar12;
  long lVar13;
  u64 uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  unsigned_long *puVar18;
  ulong uVar19;
  volume *Vol;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  int iVar25;
  long lVar26;
  brick_volume *Val;
  char cVar27;
  uint uVar28;
  iterator *piVar29;
  long *in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  extent eVar33;
  error<idx2::idx2_err_code> eVar34;
  v3i Brick3;
  extent BrickExtent;
  timer Timer;
  extent Skip;
  timespec End;
  u64 BrickKey;
  extent BrickExtentCrop;
  encode_data E;
  brick_traverse Stack [128];
  u64 auStack_2738 [73];
  extent local_24f0;
  stack_array<idx2::v3<int>,_16> *local_24e0;
  int local_24d8;
  int local_24d4;
  int local_24d0;
  uint local_24cc;
  volume local_24c8;
  ulong uStack_24a0;
  ulong uStack_2498;
  ulong uStack_2490;
  extent local_2488;
  undefined1 local_2478 [20];
  int iStack_2464;
  int iStack_2460;
  int iStack_245c;
  undefined8 uStack_2458;
  long lStack_2450;
  undefined8 uStack_2448;
  ulong uStack_2440;
  params *local_2430;
  idx2_file *local_2428;
  brick_copier *local_2420;
  v3i *local_2418;
  ulong local_2410;
  ulong local_2408;
  undefined1 local_2400 [24];
  undefined1 local_23e8 [16];
  undefined1 local_23d8 [80];
  i64 local_2388;
  i64 local_2358;
  char local_2340;
  u64 auStack_2338 [17];
  anon_union_12_8_3dedac88_for_v3<int>_1 local_22b0 [51];
  undefined8 uStack_2048;
  undefined4 auStack_2040 [2];
  free_list_allocator local_2038;
  undefined8 uStack_2010;
  undefined4 auStack_2008 [2];
  ulong auStack_2000 [1018];
  
  iVar25 = (Idx2->BrickDimsExt3).field_0.field_0.X;
  iVar17 = (Idx2->BrickDimsExt3).field_0.field_0.Y;
  iVar20 = (Idx2->BrickDimsExt3).field_0.field_0.Z;
  local_2420 = Copier;
  if (Mallocator()::Instance == '\0') {
    Encode();
  }
  free_list_allocator::free_list_allocator
            (&local_2038,(long)(iVar25 * iVar17 * iVar20 * 8),(allocator *)&Mallocator()::Instance);
  BrickAlloc_._28_4_ = local_2038.MaxBytes._4_4_;
  BrickAlloc_._24_4_ = (undefined4)local_2038.MaxBytes;
  BrickAlloc_._36_4_ = local_2038.Parent._4_4_;
  BrickAlloc_._32_4_ = local_2038.Parent._0_4_;
  BrickAlloc_._8_8_ = local_2038.Head;
  BrickAlloc_._16_8_ = local_2038.MinBytes;
  encode_data::encode_data((encode_data *)local_23d8);
  Init((encode_data *)local_23d8,(allocator *)0x0);
  local_2418 = &Idx2->BrickDimsExt3;
  lVar13 = 0x38;
  do {
    *(undefined8 *)((long)&uStack_2048 + lVar13) = 0;
    *(undefined4 *)((long)auStack_2040 + lVar13) = 0;
    *(undefined8 *)((long)&local_2038.super_allocator._vptr_allocator + lVar13) = 0;
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0x2038);
  lVar13 = (long)local_2340;
  if (0xf < lVar13) {
LAB_0018d0b9:
    pcVar24 = 
    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]";
LAB_0018d0e5:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,pcVar24);
  }
  local_24e0 = &Idx2->NBricks3;
  pvVar2 = local_24e0->Arr + lVar13;
  lVar21 = (long)(pvVar2->field_0).field_0.X;
  if (lVar21 == 0) {
    local_2038.MaxBytes._4_4_ = 1;
  }
  else {
    uVar22 = lVar21 - 1;
    lVar21 = 0x3f;
    if (uVar22 != 0) {
      for (; uVar22 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    local_2038.MaxBytes._4_4_ = (uint)(1L << (-((byte)lVar21 ^ 0x3f) & 0x3f));
    if (uVar22 == 0) {
      local_2038.MaxBytes._4_4_ = 1;
    }
  }
  lVar26 = (long)(pvVar2->field_0).field_0.Y;
  lVar21 = 0x100000000;
  if (lVar26 != 0) {
    uVar22 = lVar26 - 1;
    lVar26 = 0x3f;
    if (uVar22 != 0) {
      for (; uVar22 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    if (uVar22 != 0) {
      lVar21 = 0x100000000 << (-((byte)lVar26 ^ 0x3f) & 0x3f);
    }
  }
  lVar26 = (long)(pvVar2->field_0).field_0.Z;
  if (lVar26 == 0) {
    local_2038.Parent._4_4_ = 1;
  }
  else {
    uVar22 = lVar26 - 1;
    lVar26 = 0x3f;
    if (uVar22 != 0) {
      for (; uVar22 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    local_2038.Parent._4_4_ = 1;
    if (uVar22 != 0) {
      local_2038.Parent._4_4_ = (undefined4)(1L << (-((byte)lVar26 ^ 0x3f) & 0x3f));
    }
  }
  local_2038.super_allocator._vptr_allocator = (_func_int **)(Idx2->BricksOrder).Arr[lVar13];
  local_2038.MaxBytes._4_4_ = (uint)lVar21 | local_2038.MaxBytes._4_4_;
  local_2038.Head = (node *)local_2038.super_allocator._vptr_allocator;
  local_2038.MinBytes = 0;
  local_2038.MaxBytes._0_4_ = 0;
  local_2038.Parent._0_4_ = (undefined4)((ulong)lVar21 >> 0x20);
  uStack_2010 = 0;
  auStack_2008[0] = 0;
  auStack_2000[0] = 0;
  local_23e8._8_4_ = 1;
  local_23e8._0_8_ = 0x100000001;
  local_23e8._12_4_ = 1;
  uVar22 = 0;
  local_2430 = P;
  local_2428 = Idx2;
  do {
    Vol = &local_24c8;
    lVar13 = uVar22 * 0x40;
    piVar29 = (iterator *)((long)&local_2038 + lVar13);
    puVar4 = piVar29->Key;
    puVar18 = (unsigned_long *)((ulong)puVar4 >> 2);
    piVar29->Key = puVar18;
    uVar12 = (uint)puVar4 & 3;
    uVar19 = uVar22;
    if (uVar12 == 3) {
      if (puVar18 == (unsigned_long *)0x3) {
        piVar29->Key = *(unsigned_long **)((long)&local_2038 + lVar13 + 8);
      }
      else {
        *(unsigned_long **)((long)&local_2038 + lVar13 + 8) = puVar18;
      }
    }
    else {
      uVar19 = (ulong)((int)uVar22 - 1);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)((long)&local_2038 + lVar13 + 0x1c);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)&local_2038 + lVar13 + 0x10);
      auVar30 = vpsubd_avx(auVar30,auVar31);
      auVar30 = vpcmpeqd_avx(auVar30,local_23e8);
      auVar30 = vpmovsxdq_avx(auVar30);
      uVar16 = vmovmskpd_avx(auVar30);
      if ((((uVar16 & 1) == 0) || ((byte)((byte)uVar16 >> 1) == 0)) ||
         (*(int *)((long)&local_2038 + lVar13 + 0x24) - *(int *)((long)&local_2038 + lVar13 + 0x18)
          != 1)) {
        local_24c8.Buffer.Data = (byte *)piVar29->Key;
        local_24c8.Buffer.Bytes = *(long *)((long)&local_2038 + lVar13 + 8);
        uVar7 = *(ulong *)((long)&local_2038 + lVar13 + 0x10);
        uVar8 = *(undefined8 *)((long)&local_2038 + lVar13 + 0x18);
        local_24c8._32_8_ = *(undefined8 *)((long)&local_2038 + lVar13 + 0x20);
        uStack_24a0 = *(ulong *)(auStack_2008 + uVar22 * 0x10 + -2);
        uStack_2498 = *(ulong *)(auStack_2008 + uVar22 * 0x10);
        uStack_2490 = auStack_2000[uVar22 * 8];
        local_24c8.Buffer.Alloc._0_4_ = (int)uVar7;
        local_24c8.Buffer.Alloc._4_4_ = (uint)(uVar7 >> 0x20);
        local_24c8.Dims._0_4_ = (uint)uVar8;
        local_24c8.Dims._4_4_ = (int)((ulong)uVar8 >> 0x20);
        _local_2478 = *piVar29;
        uStack_2458 = *(undefined8 *)((long)&local_2038 + lVar13 + 0x20);
        lStack_2450 = *(long *)(auStack_2008 + uVar22 * 0x10 + -2);
        uStack_2448 = *(undefined8 *)(auStack_2008 + uVar22 * 0x10);
        uVar15 = (ulong)(uVar12 << 2);
        iVar25 = *(int *)((long)&local_2038 + uVar15 + lVar13 + 0x10);
        iVar25 = (*(int *)((long)&local_2038 + uVar15 + lVar13 + 0x1c) - iVar25) / 2 + iVar25;
        *(int *)((long)&local_24c8.Dims + uVar15 + 4) = iVar25;
        uVar11 = uStack_24a0;
        *(int *)(local_2478 + uVar15 + 0x10) = iVar25;
        local_2408 = uVar7 & 0xffffffff;
        local_2410 = (ulong)local_24c8.Buffer.Alloc._4_4_;
        local_24d0 = local_24c8.Dims._4_4_;
        uVar16 = local_24c8.Dims._4_4_ - (int)local_24c8.Buffer.Alloc;
        local_24d4 = local_24c8._32_4_;
        uVar12 = local_24c8._32_4_ - local_24c8.Buffer.Alloc._4_4_;
        local_24d8 = local_24c8._36_4_;
        uVar28 = local_24c8._36_4_ - (uint)local_24c8.Dims;
        local_24cc = (uint)local_24c8.Dims;
        local_2488.From =
             (ulong)((uint)local_24c8.Dims & 0x1fffff) << 0x2a |
             (local_2410 & 0x1fffff) << 0x15 | uVar7 & 0x1fffff;
        local_2488.Dims =
             (ulong)(uVar28 & 0x1fffff) << 0x2a |
             (ulong)(uVar12 & 0x1fffff) << 0x15 | (ulong)(uVar16 & 0x1fffff);
        lVar21 = (long)local_2340;
        if (0xf < lVar21) goto LAB_0018d0b9;
        local_24f0.From = 0;
        local_24f0.Dims =
             (ulong)(local_24e0->Arr[lVar21].field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)local_24e0->Arr[lVar21].field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)local_24e0->Arr[lVar21].field_0.field_0.X & 0x1fffff;
        eVar33 = Crop<idx2::extent,idx2::extent>(&local_2488,&local_24f0);
        uVar14 = eVar33.Dims;
        lStack_2450 = ((long)(uVar14 << 0x16) >> 0x2b) * ((long)(uVar14 << 0x2b) >> 0x2b) *
                      ((long)(uVar14 * 2) >> 0x2b) + uVar11;
        lVar21 = (long)local_2340;
        if (0xf < lVar21) goto LAB_0018d0b9;
        iVar25 = (int)uStack_2498;
        local_24f0.From = 0;
        local_24f0.Dims =
             (ulong)(local_24e0->Arr[lVar21].field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)local_24e0->Arr[lVar21].field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)local_24e0->Arr[lVar21].field_0.field_0.X & 0x1fffff;
        eVar33 = Crop<idx2::extent,idx2::extent>(&local_2488,&local_24f0);
        uStack_2448 = CONCAT44(uStack_2448._4_4_,
                               (((int)eVar33.Dims << 0xb) >> 0xb) *
                               (int)((long)(eVar33.Dims * 2) >> 0x2b) *
                               (int)((long)(eVar33.Dims << 0x16) >> 0x2b) + iVar25);
        uStack_2490 = auStack_2000[uVar22 * 8];
        uStack_2440 = (long)(int)uVar28 * (long)(int)uVar12 * (long)(int)uVar16 + uStack_2490;
        lVar21 = (long)local_2340;
        if (0xf < lVar21) goto LAB_0018d0b9;
        iVar25 = (local_24e0->Arr[lVar21].field_0.field_0.Z << 0xb) >> 0xb;
        iVar20 = (local_24e0->Arr[lVar21].field_0.field_0.X << 0xb) >> 0xb;
        iVar17 = (int)((long)((ulong)(uint)local_24e0->Arr[lVar21].field_0.field_0.Y << 0x2b) >>
                      0x2b);
        if (((((int)local_2478._16_4_ < iVar20) && (iStack_2464 < iVar17)) &&
            ((iStack_2460 < iVar25 && ((0 < iStack_245c && (0 < (int)uStack_2458)))))) &&
           (0 < uStack_2458._4_4_)) {
          *(undefined8 *)((long)&local_2038 + lVar13 + 0x20) = uStack_2458;
          *(long *)(auStack_2008 + uVar22 * 0x10 + -2) = lStack_2450;
          *(undefined8 *)(auStack_2008 + uVar22 * 0x10) = uStack_2448;
          auStack_2000[uVar22 * 8] = uStack_2440;
          *piVar29 = _local_2478;
          uVar19 = uVar22;
        }
        Idx2 = local_2428;
        if (((((int)local_2408 < iVar20) && ((int)local_2410 < iVar17)) &&
            ((int)local_24cc < iVar25)) && (0 < local_24d8 && (0 < local_24d4 && 0 < local_24d0))) {
          uVar19 = (ulong)((int)uVar19 + 1);
          auVar9._8_8_ = local_24c8.Buffer.Bytes;
          auVar9._0_8_ = local_24c8.Buffer.Data;
          auVar9._16_4_ = (int)local_24c8.Buffer.Alloc;
          auVar9._20_4_ = local_24c8.Buffer.Alloc._4_4_;
          auVar9._24_4_ = (uint)local_24c8.Dims;
          auVar9._28_4_ = local_24c8.Dims._4_4_;
          *(undefined8 *)((long)&local_2038 + uVar19 * 0x40 + 0x20) = local_24c8._32_8_;
          *(ulong *)(auStack_2008 + uVar19 * 0x10 + -2) = uStack_24a0;
          *(ulong *)(auStack_2008 + uVar19 * 0x10) = uStack_2498;
          auStack_2000[uVar19 * 8] = uStack_2490;
          *(undefined1 (*) [32])((long)&local_2038 + uVar19 * 0x40) = auVar9;
        }
      }
      else {
        clock_gettime(1,(timespec *)&local_2488);
        if (Mallocator()::Instance == '\0') {
          Encode();
        }
        auVar30 = SUB6416(ZEXT864(0),0) << 0x40;
        local_24c8.Buffer.Data = (byte *)0x0;
        local_24c8.Buffer.Bytes = 0;
        local_24c8.Buffer.Alloc._0_4_ = 0x1d1458;
        local_24c8.Buffer.Alloc._4_4_ = 0;
        local_24c8.Dims._0_4_ = 0;
        local_24c8.Dims._4_4_ = 0;
        local_24c8.Type = __Invalid__;
        uStack_24a0 = 0;
        uStack_2498 = 0;
        uStack_2490 = uStack_2490 & 0xffffffff00000000;
        Resize(Vol,local_2418,float64,(allocator *)local_23d8._0_8_);
        lVar21 = CONCAT44(local_24c8.Dims._4_4_,(uint)local_24c8.Dims);
        lVar23 = lVar21 * 2 >> 0x2b;
        lVar26 = (lVar21 << 0x16) >> 0x2b;
        if (lVar26 != 0 && (lVar23 != 0 && ((uint)local_24c8.Dims & 0x1fffff) != 0)) {
          memset(local_24c8.Buffer.Data,0,lVar23 * lVar26 * ((lVar21 << 0x2b) >> 0x2b) * 8);
        }
        uVar12 = (Idx2->BrickDims3).field_0.field_0.X;
        uVar16 = (Idx2->BrickDims3).field_0.field_0.Y;
        uVar28 = (Idx2->BrickDims3).field_0.field_0.Z;
        local_24f0.From =
             (ulong)(*(int *)((long)&local_2038 + lVar13 + 0x18) * uVar28 & 0x1fffff) << 0x2a |
             (ulong)(*(int *)((long)&local_2038 + lVar13 + 0x14) * uVar16 & 0x1fffff) << 0x15 |
             (ulong)(*(int *)((long)&local_2038 + lVar13 + 0x10) * uVar12 & 0x1fffff);
        local_24f0.Dims =
             (ulong)(uVar28 & 0x1fffff) << 0x2a |
             ((ulong)uVar16 & 0x1fffff) << 0x15 | (ulong)uVar12 & 0x1fffff;
        auVar10._8_16_ = stack0xffffffffffffdb98;
        auVar10._0_8_ =
             (ulong)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)(Idx2->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)(Idx2->Dims3).field_0.field_0.X & 0x1fffff;
        auVar10._24_8_ = 0;
        _local_2478 = (iterator)(auVar10 << 0x40);
        local_2400._8_16_ =
             (undefined1  [16])Crop<idx2::extent,idx2::extent>(&local_24f0,(extent *)local_2478);
        Val = (brick_volume *)(ulong)(local_2400._8_4_ - (int)local_24f0.From & 0x1fffff);
        uStack_24a0 = local_2400._8_8_ - (local_24f0.From & 0x7ffffc0000000000) & 0x7ffffc0000000000
                      | (ulong)Val |
                      local_2400._8_8_ * 0x800 + (local_24f0.From & 0x3ffffe00000) * -0x800 >> 0xb &
                      0x3ffffe00000;
        uStack_2498 = local_2400._16_8_ & 0x7fffffffffffffff;
        (**local_2420->_vptr_brick_copier)(local_2420,local_2400 + 8,&uStack_24a0,Vol);
        aVar3 = (Idx2->ValueRange).field_0.field_0;
        auVar32._8_8_ = aVar3.Y;
        auVar32._0_8_ = auVar30._0_8_;
        auVar6 = vunpcklpd_avx((undefined1  [16])aVar3,auVar31);
        auVar6 = vcmppd_avx(auVar32,auVar6,1);
        auVar30 = vunpcklpd_avx(auVar30,auVar31);
        aVar5.field_0 =
             (anon_struct_16_2_94731cea_for_anon_union_16_4_6ba14846_for_v2<double>_1_0)
             vblendvpd_avx(aVar3,auVar30,auVar6);
        (Idx2->ValueRange).field_0 = aVar5;
        local_2340 = '\0';
        local_22b0[0]._8_4_ = *(uint *)((long)&local_2038 + lVar13 + 0x18);
        local_22b0[0]._0_8_ =
             ((anon_union_8_4_6ba14846_for_v2<int>_1 *)((long)&local_2038 + lVar13 + 0x10))->field_0
        ;
        Brick3.field_0.field_0.Y = 0;
        Brick3.field_0.field_0.X = local_22b0[0]._8_4_;
        Brick3.field_0._8_4_ = SUB84(Val,0);
        uVar14 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)0x0,(int)local_22b0[0]._0_8_,Brick3);
        lVar13 = (long)local_2340;
        if (0xf < lVar13) {
          pcVar24 = 
          "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
          ;
          goto LAB_0018d0e5;
        }
        auStack_2338[lVar13] = uVar14;
        local_2400._0_8_ = uVar14 * 0x10 + lVar13;
        Insert<unsigned_long,idx2::brick_volume>
                  ((iterator *)local_2478,(idx2 *)(local_23d8 + 8),
                   (hash_table<unsigned_long,_idx2::brick_volume> *)local_2400,(unsigned_long *)Vol,
                   Val);
        EncodeBrick(Idx2,(params *)local_23d8,(encode_data *)0x0,SUB81(Vol,0));
        clock_gettime(1,(timespec *)local_2478);
        TotalTime_ = (double)(long)((double)(long)(local_2478._0_8_ - local_2488.From) *
                                    1000000000.0 +
                                   (double)(long)(local_2478._8_8_ - local_2488.Dims)) /
                     1000000000.0 + TotalTime_;
      }
    }
    uVar22 = uVar19;
  } while (-1 < (int)uVar19);
  clock_gettime(1,(timespec *)&local_24c8);
  eVar34 = FlushChunks(Idx2,(encode_data *)local_23d8);
  pcVar24 = eVar34.Msg;
  if (eVar34.Code == NoError) {
    eVar34 = FlushChunkExponents(Idx2,(encode_data *)local_23d8);
    pcVar24 = eVar34.Msg;
    if (eVar34.Code == NoError) {
      clock_gettime(1,(timespec *)&local_2038);
      P_00 = local_2430;
      TotalTime_ = (double)(long)((double)((long)local_2038.super_allocator._vptr_allocator -
                                          (long)local_24c8.Buffer.Data) * 1000000000.0 +
                                 (double)((long)local_2038.Head - local_24c8.Buffer.Bytes)) /
                   1000000000.0 + TotalTime_;
      __s = (cstr)(*in_FS_OFFSET + -0xf80);
      pmVar1 = &local_2430->Meta;
      pcVar24 = (local_2430->Meta).Field;
      snprintf(__s,0x400,"%s/%s/%s.idx2",local_2430->OutDir,pmVar1,pcVar24);
      WriteMetaFile(Idx2,P_00,__s);
      printf("num channels            = %li\n",local_2388);
      printf("num sub channels        = %li\n",local_2358);
      snprintf(__s,0x400,"%s/%s/%s.idx2",P_00->OutDir,pmVar1,pcVar24);
      PrintStats(__s);
      printf("total time              = %f seconds\n",TotalTime_);
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1bb;
      pcVar24 = "";
      uVar22 = 0;
      goto LAB_0018cf34;
    }
    uVar22 = eVar34._8_8_ >> 8 & 0xffffff;
    cVar27 = (char)uVar22;
    if ('?' < cVar27) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
                    ,0x1b0,
                    "auto idx2::Encode(idx2_file *, const params &, brick_copier &)::(anonymous class)::operator()() const"
                   );
    }
    uVar12 = eVar34._8_4_ & 0xff00ff | ((int)uVar22 + 1U & 0xff) << 8;
    lVar13 = (long)cVar27;
    *(undefined4 *)(*in_FS_OFFSET + -0x97c + lVar13 * 4) = 0x1b0;
  }
  else {
    uVar22 = eVar34._8_8_ >> 8 & 0xffffff;
    cVar27 = (char)uVar22;
    if ('?' < cVar27) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
                    ,0x1af,
                    "auto idx2::Encode(idx2_file *, const params &, brick_copier &)::(anonymous class)::operator()() const"
                   );
    }
    uVar12 = eVar34._8_4_ & 0xff00ff | ((int)uVar22 + 1U & 0xff) << 8;
    lVar13 = (long)cVar27;
    *(undefined4 *)(*in_FS_OFFSET + -0x97c + lVar13 * 4) = 0x1af;
  }
  uVar22 = (ulong)uVar12;
  *(char **)(*in_FS_OFFSET + -0xb78 + lVar13 * 8) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
  ;
LAB_0018cf34:
  Dealloc((encode_data *)local_23d8);
  eVar34.Code = (char)uVar22;
  eVar34.StackIdx = (char)(uVar22 >> 8);
  eVar34.StrGened = (bool)(char)(uVar22 >> 0x10);
  eVar34._11_5_ = (int5)(uVar22 >> 0x18);
  eVar34.Msg = pcVar24;
  return eVar34;
}

Assistant:

error<idx2_err_code>
Encode(idx2_file* Idx2, const params& P, brick_copier& Copier)
{
  const int BrickBytes = Prod(Idx2->BrickDimsExt3) * sizeof(f64);
  BrickAlloc_ = free_list_allocator(BrickBytes);
  idx2_RAII(encode_data, E, Init(&E));
  idx2_BrickTraverse(
    timer Timer; StartTimer(&Timer);
    //    idx2_Assert(GetLinearBrick(*Idx2, 0, Top.BrickFrom3) == Top.Address);
    //    idx2_Assert(GetSpatialBrick(*Idx2, 0, Top.Address) == Top.BrickFrom3);
    // BVol = local brick storage (we will copy brick data from the input to this)
    brick_volume BVol;
    Resize(&BVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E.Alloc);
    Fill(idx2_Range(f64, BVol.Vol), 0.0);
    extent BrickExtent(Top.BrickFrom3 * Idx2->BrickDims3, Idx2->BrickDims3);
    // BrickExtentCrop = the true extent of the brick (boundary bricks are cropped)
    extent BrickExtentCrop = Crop(BrickExtent, extent(Idx2->Dims3));
    BVol.ExtentLocal = Relative(BrickExtentCrop, BrickExtent);
    v2d MinMax = Copier.Copy(BrickExtentCrop, BVol.ExtentLocal, &BVol);
    Idx2->ValueRange.Min = Min(Idx2->ValueRange.Min, MinMax.Min);
    Idx2->ValueRange.Max = Max(Idx2->ValueRange.Max, MinMax.Max);
    //    Copy(BrickExtentCrop, Vol, BVol.ExtentLocal, &BVol.Vol);
    E.Level = 0;
    E.Bricks3[E.Level] = Top.BrickFrom3;
    E.Brick[E.Level] = GetLinearBrick(*Idx2, E.Level, E.Bricks3[E.Level]);
    idx2_Assert(E.Brick[E.Level] == Top.Address);
    u64 BrickKey = GetBrickKey(E.Level, E.Brick[E.Level]);
    Insert(&E.BrickPool, BrickKey, BVol);
    EncodeBrick(Idx2, P, &E);
    TotalTime_ += Seconds(ElapsedTime(&Timer));
    ,
    128,
    Idx2->BricksOrder[E.Level],
    v3i(0),
    Idx2->NBricks3[E.Level],
    extent(Idx2->NBricks3[E.Level]),
    extent(Idx2->NBricks3[E.Level])
  );

  /* dump the bit streams to files */
  timer Timer;
  StartTimer(&Timer);
  idx2_PropagateIfError(FlushChunks(*Idx2, &E));
  idx2_PropagateIfError(FlushChunkExponents(*Idx2, &E));
  TotalTime_ += Seconds(ElapsedTime(&Timer));

  cstr MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  WriteMetaFile(*Idx2, P, MetaFileName);
  printf("num channels            = %" PRIi64 "\n", Size(E.Channels));
  printf("num sub channels        = %" PRIi64 "\n", Size(E.SubChannels));
  MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  PrintStats(MetaFileName);
  printf("total time              = %f seconds\n", TotalTime_);
  //  _ASSERTE( _CrtCheckMemory( ) );
  return idx2_Error(idx2_err_code::NoError);
}